

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O3

CURLcode tftp_rx(tftp_state_data *state,tftp_event_t event)

{
  unsigned_short uVar1;
  Curl_easy *data;
  uint uVar2;
  ssize_t sVar3;
  int *piVar4;
  char *pcVar5;
  ushort uVar6;
  char buffer [256];
  char acStack_118 [256];
  
  data = state->conn->data;
  switch(event) {
  case TFTP_EVENT_DATA:
    uVar6 = *(ushort *)((state->rpacket).data + 2);
    uVar6 = uVar6 << 8 | uVar6 >> 8;
    uVar2 = *(int *)&state->block + 1;
    if ((ushort)uVar2 == uVar6) {
      state->retries = 0;
    }
    else {
      if ((ushort)*(int *)&state->block != uVar6) {
        Curl_infof(data,"Received unexpected DATA packet block %d, expecting block %d\n",
                   (ulong)uVar6,(ulong)(uVar2 & 0xffff));
        return CURLE_OK;
      }
      Curl_infof(data,"Received last DATA packet block %d again.\n",(ulong)uVar6);
    }
    state->block = uVar6;
    *(state->spacket).data = '\0';
    (state->spacket).data[1] = '\x04';
    uVar1 = state->block;
    (state->spacket).data[2] = (uchar)(uVar1 >> 8);
    (state->spacket).data[3] = (uchar)uVar1;
    sVar3 = sendto(state->sockfd,(state->spacket).data,4,0x4000,(sockaddr *)&state->remote_addr,
                   state->remote_addrlen);
    if (-1 < sVar3) {
      state->state = (uint)((long)state->rbytes < (long)state->blksize + 4) * 2 + TFTP_STATE_RX;
LAB_00144829:
      time(&state->rx_time);
      return CURLE_OK;
    }
    break;
  default:
    Curl_failf(data,"%s","tftp_rx: internal error");
    return CURLE_TFTP_ILLEGAL;
  case TFTP_EVENT_ERROR:
    *(state->spacket).data = '\0';
    (state->spacket).data[1] = '\x05';
    uVar1 = state->block;
    (state->spacket).data[2] = (uchar)(uVar1 >> 8);
    (state->spacket).data[3] = (uchar)uVar1;
    sendto(state->sockfd,(state->spacket).data,4,0x4000,(sockaddr *)&state->remote_addr,
           state->remote_addrlen);
    state->state = TFTP_STATE_FIN;
    return CURLE_OK;
  case TFTP_EVENT_OACK:
    state->block = 0;
    state->retries = 0;
    *(state->spacket).data = '\0';
    (state->spacket).data[1] = '\x04';
    uVar1 = state->block;
    (state->spacket).data[2] = (uchar)(uVar1 >> 8);
    (state->spacket).data[3] = (uchar)uVar1;
    sVar3 = sendto(state->sockfd,(state->spacket).data,4,0x4000,(sockaddr *)&state->remote_addr,
                   state->remote_addrlen);
    if (-1 < sVar3) {
      state->state = TFTP_STATE_RX;
      goto LAB_00144829;
    }
    break;
  case TFTP_EVENT_TIMEOUT:
    state->retries = state->retries + 1;
    Curl_infof(data,"Timeout waiting for block %d ACK.  Retries = %d\n",
               (ulong)(*(int *)&state->block + 1U & 0xffff));
    if (state->retry_max < state->retries) {
      state->error = TFTP_ERR_TIMEOUT;
      state->state = TFTP_STATE_FIN;
      return CURLE_OK;
    }
    sVar3 = sendto(state->sockfd,(state->spacket).data,4,0x4000,(sockaddr *)&state->remote_addr,
                   state->remote_addrlen);
    if (-1 < sVar3) {
      return CURLE_OK;
    }
  }
  piVar4 = __errno_location();
  pcVar5 = Curl_strerror(*piVar4,acStack_118,0x100);
  Curl_failf(data,"%s",pcVar5);
  return CURLE_SEND_ERROR;
}

Assistant:

static CURLcode tftp_rx(struct tftp_state_data *state,
                        tftp_event_t event)
{
  ssize_t sbytes;
  int rblock;
  struct Curl_easy *data = state->conn->data;
  char buffer[STRERROR_LEN];

  switch(event) {

  case TFTP_EVENT_DATA:
    /* Is this the block we expect? */
    rblock = getrpacketblock(&state->rpacket);
    if(NEXT_BLOCKNUM(state->block) == rblock) {
      /* This is the expected block.  Reset counters and ACK it. */
      state->retries = 0;
    }
    else if(state->block == rblock) {
      /* This is the last recently received block again. Log it and ACK it
         again. */
      infof(data, "Received last DATA packet block %d again.\n", rblock);
    }
    else {
      /* totally unexpected, just log it */
      infof(data,
            "Received unexpected DATA packet block %d, expecting block %d\n",
            rblock, NEXT_BLOCKNUM(state->block));
      break;
    }

    /* ACK this block. */
    state->block = (unsigned short)rblock;
    setpacketevent(&state->spacket, TFTP_EVENT_ACK);
    setpacketblock(&state->spacket, state->block);
    sbytes = sendto(state->sockfd, (void *)state->spacket.data,
                    4, SEND_4TH_ARG,
                    (struct sockaddr *)&state->remote_addr,
                    state->remote_addrlen);
    if(sbytes < 0) {
      failf(data, "%s", Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
      return CURLE_SEND_ERROR;
    }

    /* Check if completed (That is, a less than full packet is received) */
    if(state->rbytes < (ssize_t)state->blksize + 4) {
      state->state = TFTP_STATE_FIN;
    }
    else {
      state->state = TFTP_STATE_RX;
    }
    time(&state->rx_time);
    break;

  case TFTP_EVENT_OACK:
    /* ACK option acknowledgement so we can move on to data */
    state->block = 0;
    state->retries = 0;
    setpacketevent(&state->spacket, TFTP_EVENT_ACK);
    setpacketblock(&state->spacket, state->block);
    sbytes = sendto(state->sockfd, (void *)state->spacket.data,
                    4, SEND_4TH_ARG,
                    (struct sockaddr *)&state->remote_addr,
                    state->remote_addrlen);
    if(sbytes < 0) {
      failf(data, "%s", Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
      return CURLE_SEND_ERROR;
    }

    /* we're ready to RX data */
    state->state = TFTP_STATE_RX;
    time(&state->rx_time);
    break;

  case TFTP_EVENT_TIMEOUT:
    /* Increment the retry count and fail if over the limit */
    state->retries++;
    infof(data,
          "Timeout waiting for block %d ACK.  Retries = %d\n",
          NEXT_BLOCKNUM(state->block), state->retries);
    if(state->retries > state->retry_max) {
      state->error = TFTP_ERR_TIMEOUT;
      state->state = TFTP_STATE_FIN;
    }
    else {
      /* Resend the previous ACK */
      sbytes = sendto(state->sockfd, (void *)state->spacket.data,
                      4, SEND_4TH_ARG,
                      (struct sockaddr *)&state->remote_addr,
                      state->remote_addrlen);
      if(sbytes<0) {
        failf(data, "%s", Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
        return CURLE_SEND_ERROR;
      }
    }
    break;

  case TFTP_EVENT_ERROR:
    setpacketevent(&state->spacket, TFTP_EVENT_ERROR);
    setpacketblock(&state->spacket, state->block);
    (void)sendto(state->sockfd, (void *)state->spacket.data,
                 4, SEND_4TH_ARG,
                 (struct sockaddr *)&state->remote_addr,
                 state->remote_addrlen);
    /* don't bother with the return code, but if the socket is still up we
     * should be a good TFTP client and let the server know we're done */
    state->state = TFTP_STATE_FIN;
    break;

  default:
    failf(data, "%s", "tftp_rx: internal error");
    return CURLE_TFTP_ILLEGAL; /* not really the perfect return code for
                                  this */
  }
  return CURLE_OK;
}